

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_color_hsva_b(nk_byte *h,nk_byte *s,nk_byte *v,nk_byte *a,nk_color in)

{
  nk_byte local_48 [4];
  nk_byte local_44 [4];
  int tmp [4];
  nk_byte *a_local;
  nk_byte *v_local;
  nk_byte *s_local;
  nk_byte *h_local;
  nk_color in_local;
  
  nk_color_hsva_i((int *)local_48,(int *)local_44,tmp,tmp + 1,in);
  *h = local_48[0];
  *s = local_44[0];
  *v = (nk_byte)tmp[0];
  *a = (nk_byte)tmp[1];
  return;
}

Assistant:

NK_API void
nk_color_hsva_b(nk_byte *h, nk_byte *s, nk_byte *v, nk_byte *a, struct nk_color in)
{
    int tmp[4];
    nk_color_hsva_i(&tmp[0], &tmp[1], &tmp[2], &tmp[3], in);
    *h = (nk_byte)tmp[0];
    *s = (nk_byte)tmp[1];
    *v = (nk_byte)tmp[2];
    *a = (nk_byte)tmp[3];
}